

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cli.c
# Opt level: O1

int ssl_parse_server_hello(mbedtls_ssl_context *ssl)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  mbedtls_ssl_handshake_params *pmVar4;
  mbedtls_ssl_config *pmVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  ushort uVar10;
  int iVar11;
  uint uVar12;
  uchar *__dest;
  ulong uVar13;
  mbedtls_ssl_ciphersuite_t *pmVar14;
  time_t tVar15;
  int *piVar16;
  uchar message;
  ulong uVar17;
  mbedtls_ssl_session *extraout_RDX;
  mbedtls_ssl_session *extraout_RDX_00;
  mbedtls_ssl_session *extraout_RDX_01;
  mbedtls_ssl_session *extraout_RDX_02;
  mbedtls_ssl_session *extraout_RDX_03;
  mbedtls_ssl_session *extraout_RDX_04;
  mbedtls_ssl_session *extraout_RDX_05;
  mbedtls_ssl_session *extraout_RDX_06;
  mbedtls_ssl_session *extraout_RDX_07;
  mbedtls_ssl_session *pmVar18;
  uint uVar19;
  uchar *puVar20;
  ulong uVar21;
  ushort *puVar22;
  bool bVar23;
  int major_ver;
  int local_38;
  int local_34;
  
  puVar20 = ssl->in_msg;
  iVar11 = mbedtls_ssl_read_record(ssl);
  if (iVar11 != 0) {
    return iVar11;
  }
  if (ssl->in_msgtype != 0x16) {
    if (ssl->renego_status != 1) {
      mbedtls_ssl_send_alert_message(ssl,'\x02','\n');
      return -0x7700;
    }
    iVar11 = ssl->renego_records_seen;
    ssl->renego_records_seen = iVar11 + 1;
    iVar3 = ssl->conf->renego_max_records;
    if (iVar3 <= iVar11 && -1 < iVar3) {
      return -0x7700;
    }
    ssl->keep_current_message = 1;
    return -0x6b00;
  }
  if ((ssl->conf->field_0x174 & 2) == 0) {
LAB_00117eeb:
    uVar19 = *(uint *)&ssl->conf->field_0x174;
    uVar13 = (ulong)((uVar19 & 2) << 2);
    if ((uVar13 + 0x2a <= ssl->in_hslen) && (*puVar20 == '\x02')) {
      puVar20 = puVar20 + (uVar13 | 4);
      piVar16 = &ssl->minor_ver;
      mbedtls_ssl_read_version(&ssl->major_ver,piVar16,uVar19 >> 1 & 1,puVar20);
      pmVar5 = ssl->conf;
      if ((ssl->major_ver < (int)(uint)pmVar5->min_major_ver) ||
         (((*piVar16 < (int)(uint)pmVar5->min_minor_ver ||
           ((int)(uint)pmVar5->max_major_ver < ssl->major_ver)) ||
          ((int)(uint)pmVar5->max_minor_ver < *piVar16)))) {
LAB_00117f6b:
        mbedtls_ssl_send_alert_message(ssl,'\x02','F');
        return -0x6e80;
      }
      pmVar4 = ssl->handshake;
      uVar6 = *(undefined8 *)(puVar20 + 2);
      uVar7 = *(undefined8 *)(puVar20 + 10);
      uVar8 = *(undefined8 *)(puVar20 + 0x1a);
      *(undefined8 *)(pmVar4->randbytes + 0x30) = *(undefined8 *)(puVar20 + 0x12);
      *(undefined8 *)(pmVar4->randbytes + 0x38) = uVar8;
      *(undefined8 *)(pmVar4->randbytes + 0x20) = uVar6;
      *(undefined8 *)(pmVar4->randbytes + 0x28) = uVar7;
      uVar13 = (ulong)puVar20[0x22];
      if (uVar13 < 0x21) {
        uVar21 = ssl->in_hslen;
        uVar17 = (ulong)((ssl->conf->field_0x174 & 2) >> 1);
        lVar1 = uVar17 * 8 + 4;
        if (uVar13 + uVar17 * 8 + 0x2b < uVar21) {
          uVar17 = (ulong)(ushort)(*(ushort *)(puVar20 + uVar13 + 0x26) << 8 |
                                  *(ushort *)(puVar20 + uVar13 + 0x26) >> 8);
          if ((2 < uVar17 - 1) && (uVar21 == lVar1 + uVar13 + uVar17 + 0x28)) {
LAB_0011803d:
            if (puVar20[uVar13 + 0x25] != '\0') {
              mbedtls_ssl_send_alert_message(ssl,'\x02','/');
              return -0x7080;
            }
            uVar10 = *(ushort *)(puVar20 + uVar13 + 0x23) << 8 |
                     *(ushort *)(puVar20 + uVar13 + 0x23) >> 8;
            uVar19 = (uint)uVar10;
            pmVar14 = mbedtls_ssl_ciphersuite_from_id((uint)uVar10);
            ssl->transform_negotiate->ciphersuite_info = pmVar14;
            if (pmVar14 == (mbedtls_ssl_ciphersuite_t *)0x0) {
              mbedtls_ssl_send_alert_message(ssl,'\x02','P');
              return -0x7100;
            }
            mbedtls_ssl_optimize_checksum(ssl,pmVar14);
            pmVar4 = ssl->handshake;
            if (((uVar13 == 0) || (pmVar4->resume == 0)) ||
               ((ssl->renego_status != 0 ||
                ((((pmVar18 = ssl->session_negotiate, pmVar18->ciphersuite != (uint)uVar10 ||
                   (pmVar18->compression != 0)) || (pmVar18->id_len != uVar13)) ||
                 (iVar11 = bcmp(pmVar18->id,puVar20 + 0x23,uVar13), iVar11 != 0)))))) {
              ssl->state = ssl->state + 1;
              pmVar4->resume = 0;
              tVar15 = time((time_t *)0x0);
              pmVar18 = ssl->session_negotiate;
              pmVar18->start = tVar15;
              pmVar18->ciphersuite = (uint)uVar10;
              pmVar18->compression = 0;
              pmVar18->id_len = uVar13;
              memcpy(pmVar18->id,puVar20 + 0x23,uVar13);
            }
            else {
              ssl->state = 0xc;
              iVar11 = mbedtls_ssl_derive_keys(ssl);
              if (iVar11 != 0) {
                mbedtls_ssl_send_alert_message(ssl,'\x02','P');
                return iVar11;
              }
            }
            pmVar14 = mbedtls_ssl_ciphersuite_from_id(ssl->session_negotiate->ciphersuite);
            if ((pmVar14 == (mbedtls_ssl_ciphersuite_t *)0x0) ||
               (((ssl->conf->field_0x174 & 0x40) != 0 &&
                (pmVar14->cipher == MBEDTLS_CIPHER_ARC4_128)))) {
LAB_0011813a:
              message = '/';
            }
            else {
              piVar16 = ssl->conf->ciphersuite_list[*piVar16];
              do {
                iVar11 = *piVar16;
                if (iVar11 == 0) goto LAB_0011813a;
                pmVar18 = ssl->session_negotiate;
                piVar16 = piVar16 + 1;
              } while (iVar11 != pmVar18->ciphersuite);
              pmVar18->compression = 0;
              puVar22 = (ushort *)(puVar20 + uVar13 + 0x28);
              bVar9 = false;
              while (uVar17 != 0) {
                uVar10 = puVar22[1] << 8 | puVar22[1] >> 8;
                puVar20 = (uchar *)(ulong)uVar10;
                uVar13 = (ulong)(uVar10 + 4);
                uVar21 = uVar17 - uVar13;
                if (uVar17 < uVar13) {
                  mbedtls_ssl_send_alert_message(ssl,'\x02','2');
                  bVar23 = false;
                  pmVar18 = extraout_RDX;
                  uVar19 = 0xffff8680;
                }
                else {
                  uVar10 = *puVar22 << 8 | *puVar22 >> 8;
                  if (uVar10 < 0x16) {
                    if (10 < uVar10) {
                      if (uVar10 == 0xb) {
                        uVar12 = ssl_parse_supported_point_formats_ext
                                           (ssl,(uchar *)(puVar22 + 2),(size_t)puVar20);
                        pmVar18 = extraout_RDX_06;
                      }
                      else {
                        if (uVar10 != 0x10) goto LAB_001182ae;
                        uVar12 = ssl_parse_alpn_ext(ssl,(uchar *)(puVar22 + 2),(size_t)puVar20);
                        pmVar18 = extraout_RDX_02;
                      }
                      goto LAB_001182a1;
                    }
                    if (uVar10 == 1) {
                      uVar12 = ssl_parse_max_fragment_length_ext
                                         (ssl,(uchar *)(puVar22 + 2),(size_t)puVar20);
                      pmVar18 = extraout_RDX_04;
                      goto LAB_001182a1;
                    }
                    if (uVar10 == 4) {
                      uVar12 = ssl_parse_truncated_hmac_ext(ssl,puVar20,(size_t)pmVar18);
                      pmVar18 = extraout_RDX_00;
                      goto LAB_001182a1;
                    }
                  }
                  else {
                    if (uVar10 < 0x23) {
                      if (uVar10 == 0x16) {
                        uVar12 = ssl_parse_encrypt_then_mac_ext(ssl,puVar20,(size_t)pmVar18);
                        pmVar18 = extraout_RDX_05;
                      }
                      else {
                        if (uVar10 != 0x17) goto LAB_001182ae;
                        uVar12 = ssl_parse_extended_ms_ext(ssl,puVar20,(size_t)pmVar18);
                        pmVar18 = extraout_RDX_01;
                      }
                    }
                    else if (uVar10 == 0x23) {
                      uVar12 = ssl_parse_session_ticket_ext(ssl,puVar20,(size_t)pmVar18);
                      pmVar18 = extraout_RDX_07;
                    }
                    else {
                      if (uVar10 != 0xff01) goto LAB_001182ae;
                      uVar12 = ssl_parse_renegotiation_info
                                         (ssl,(uchar *)(puVar22 + 2),(size_t)puVar20);
                      bVar9 = true;
                      pmVar18 = extraout_RDX_03;
                    }
LAB_001182a1:
                    if (uVar12 != 0) {
                      bVar23 = false;
                      uVar19 = uVar12;
                      goto LAB_001182c4;
                    }
                  }
LAB_001182ae:
                  puVar22 = (ushort *)((long)puVar22 + uVar13);
                  bVar23 = uVar21 - 4 < 0xfffffffffffffffd;
                  uVar17 = uVar21;
                  if (!bVar23) {
                    uVar19 = 0xffff8680;
                  }
                }
LAB_001182c4:
                if (!bVar23) {
                  return uVar19;
                }
              }
              iVar11 = ssl->secure_renegotiation;
              if ((iVar11 != 0) || ((*(uint *)&ssl->conf->field_0x174 & 0x30) != 0x20)) {
                if (ssl->renego_status != 1) {
                  return 0;
                }
                if ((iVar11 != 1 || bVar9) &&
                   (((iVar11 != 0 || ((ssl->conf->field_0x174 & 0x30) != 0)) &&
                    (iVar11 != 0 || !bVar9)))) {
                  return 0;
                }
              }
              message = '(';
            }
            goto LAB_00117fbb;
          }
        }
        else if (uVar21 == lVar1 + uVar13 + 0x26) {
          uVar17 = 0;
          goto LAB_0011803d;
        }
      }
    }
  }
  else {
    if (*puVar20 != '\x03') {
      free(ssl->handshake->verify_cookie);
      pmVar4 = ssl->handshake;
      pmVar4->verify_cookie = (uchar *)0x0;
      pmVar4->verify_cookie_len = '\0';
      goto LAB_00117eeb;
    }
    puVar20 = ssl->in_msg;
    mbedtls_ssl_read_version(&local_34,&local_38,1,puVar20 + 0xc);
    if (((local_38 < 2 || local_34 < 3) || ((int)(uint)ssl->conf->max_major_ver < local_34)) ||
       ((int)(uint)ssl->conf->max_minor_ver < local_38)) goto LAB_00117f6b;
    bVar2 = puVar20[0xe];
    uVar13 = (ulong)bVar2;
    if ((long)uVar13 <= (long)(ssl->in_msg + (ssl->in_msglen - (long)(puVar20 + 0xf)))) {
      free(ssl->handshake->verify_cookie);
      __dest = (uchar *)calloc(1,uVar13);
      pmVar4 = ssl->handshake;
      pmVar4->verify_cookie = __dest;
      if (__dest != (uchar *)0x0) {
        memcpy(__dest,puVar20 + 0xf,uVar13);
        pmVar4->verify_cookie_len = bVar2;
        ssl->state = 1;
        mbedtls_ssl_reset_checksum(ssl);
        mbedtls_ssl_recv_flight_completed(ssl);
        return 0;
      }
      return -0x7f00;
    }
  }
  message = '2';
LAB_00117fbb:
  mbedtls_ssl_send_alert_message(ssl,'\x02',message);
  return -0x7980;
}

Assistant:

static int ssl_parse_server_hello( mbedtls_ssl_context *ssl )
{
    int ret, i;
    size_t n;
    size_t ext_len;
    unsigned char *buf, *ext;
    unsigned char comp;
#if defined(MBEDTLS_ZLIB_SUPPORT)
    int accept_comp;
#endif
#if defined(MBEDTLS_SSL_RENEGOTIATION)
    int renegotiation_info_seen = 0;
#endif
    int handshake_failure = 0;
    const mbedtls_ssl_ciphersuite_t *suite_info;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> parse server hello" ) );

    buf = ssl->in_msg;

    if( ( ret = mbedtls_ssl_read_record( ssl ) ) != 0 )
    {
        /* No alert on a read error. */
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_read_record", ret );
        return( ret );
    }

    if( ssl->in_msgtype != MBEDTLS_SSL_MSG_HANDSHAKE )
    {
#if defined(MBEDTLS_SSL_RENEGOTIATION)
        if( ssl->renego_status == MBEDTLS_SSL_RENEGOTIATION_IN_PROGRESS )
        {
            ssl->renego_records_seen++;

            if( ssl->conf->renego_max_records >= 0 &&
                ssl->renego_records_seen > ssl->conf->renego_max_records )
            {
                MBEDTLS_SSL_DEBUG_MSG( 1, ( "renegotiation requested, "
                                    "but not honored by server" ) );
                return( MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE );
            }

            MBEDTLS_SSL_DEBUG_MSG( 1, ( "non-handshake message during renego" ) );

            ssl->keep_current_message = 1;
            return( MBEDTLS_ERR_SSL_WAITING_SERVER_HELLO_RENEGO );
        }
#endif /* MBEDTLS_SSL_RENEGOTIATION */

        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server hello message" ) );
        mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                        MBEDTLS_SSL_ALERT_MSG_UNEXPECTED_MESSAGE );
        return( MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE );
    }

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
    {
        if( buf[0] == MBEDTLS_SSL_HS_HELLO_VERIFY_REQUEST )
        {
            MBEDTLS_SSL_DEBUG_MSG( 2, ( "received hello verify request" ) );
            MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= parse server hello" ) );
            return( ssl_parse_hello_verify_request( ssl ) );
        }
        else
        {
            /* We made it through the verification process */
            mbedtls_free( ssl->handshake->verify_cookie );
            ssl->handshake->verify_cookie = NULL;
            ssl->handshake->verify_cookie_len = 0;
        }
    }
#endif /* MBEDTLS_SSL_PROTO_DTLS */

    if( ssl->in_hslen < 38 + mbedtls_ssl_hs_hdr_len( ssl ) ||
        buf[0] != MBEDTLS_SSL_HS_SERVER_HELLO )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server hello message" ) );
        mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                        MBEDTLS_SSL_ALERT_MSG_DECODE_ERROR );
        return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO );
    }

    /*
     *  0   .  1    server_version
     *  2   . 33    random (maybe including 4 bytes of Unix time)
     * 34   . 34    session_id length = n
     * 35   . 34+n  session_id
     * 35+n . 36+n  cipher_suite
     * 37+n . 37+n  compression_method
     *
     * 38+n . 39+n  extensions length (optional)
     * 40+n .  ..   extensions
     */
    buf += mbedtls_ssl_hs_hdr_len( ssl );

    MBEDTLS_SSL_DEBUG_BUF( 3, "server hello, version", buf + 0, 2 );
    mbedtls_ssl_read_version( &ssl->major_ver, &ssl->minor_ver,
                      ssl->conf->transport, buf + 0 );

    if( ssl->major_ver < ssl->conf->min_major_ver ||
        ssl->minor_ver < ssl->conf->min_minor_ver ||
        ssl->major_ver > ssl->conf->max_major_ver ||
        ssl->minor_ver > ssl->conf->max_minor_ver )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "server version out of bounds - "
                            " min: [%d:%d], server: [%d:%d], max: [%d:%d]",
                            ssl->conf->min_major_ver, ssl->conf->min_minor_ver,
                            ssl->major_ver, ssl->minor_ver,
                            ssl->conf->max_major_ver, ssl->conf->max_minor_ver ) );

        mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                     MBEDTLS_SSL_ALERT_MSG_PROTOCOL_VERSION );

        return( MBEDTLS_ERR_SSL_BAD_HS_PROTOCOL_VERSION );
    }

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "server hello, current time: %lu",
                           ( (uint32_t) buf[2] << 24 ) |
                           ( (uint32_t) buf[3] << 16 ) |
                           ( (uint32_t) buf[4] <<  8 ) |
                           ( (uint32_t) buf[5]       ) ) );

    memcpy( ssl->handshake->randbytes + 32, buf + 2, 32 );

    n = buf[34];

    MBEDTLS_SSL_DEBUG_BUF( 3,   "server hello, random bytes", buf + 2, 32 );

    if( n > 32 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server hello message" ) );
        mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                        MBEDTLS_SSL_ALERT_MSG_DECODE_ERROR );
        return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO );
    }

    if( ssl->in_hslen > mbedtls_ssl_hs_hdr_len( ssl ) + 39 + n )
    {
        ext_len = ( ( buf[38 + n] <<  8 )
                  | ( buf[39 + n]       ) );

        if( ( ext_len > 0 && ext_len < 4 ) ||
            ssl->in_hslen != mbedtls_ssl_hs_hdr_len( ssl ) + 40 + n + ext_len )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server hello message" ) );
            mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                            MBEDTLS_SSL_ALERT_MSG_DECODE_ERROR );
            return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO );
        }
    }
    else if( ssl->in_hslen == mbedtls_ssl_hs_hdr_len( ssl ) + 38 + n )
    {
        ext_len = 0;
    }
    else
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad server hello message" ) );
        mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                        MBEDTLS_SSL_ALERT_MSG_DECODE_ERROR );
        return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_HELLO );
    }

    /* ciphersuite (used later) */
    i = ( buf[35 + n] << 8 ) | buf[36 + n];

    /*
     * Read and check compression
     */
    comp = buf[37 + n];

#if defined(MBEDTLS_ZLIB_SUPPORT)
    /* See comments in ssl_write_client_hello() */
#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
        accept_comp = 0;
    else
#endif
        accept_comp = 1;

    if( comp != MBEDTLS_SSL_COMPRESS_NULL &&
        ( comp != MBEDTLS_SSL_COMPRESS_DEFLATE || accept_comp == 0 ) )
#else /* MBEDTLS_ZLIB_SUPPORT */
    if( comp != MBEDTLS_SSL_COMPRESS_NULL )
#endif/* MBEDTLS_ZLIB_SUPPORT */
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "server hello, bad compression: %d", comp ) );
        mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                        MBEDTLS_SSL_ALERT_MSG_ILLEGAL_PARAMETER );
        return( MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE );
    }

    /*
     * Initialize update checksum functions
     */
    ssl->transform_negotiate->ciphersuite_info = mbedtls_ssl_ciphersuite_from_id( i );

    if( ssl->transform_negotiate->ciphersuite_info == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "ciphersuite info for %04x not found", i ) );
        mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                        MBEDTLS_SSL_ALERT_MSG_INTERNAL_ERROR );
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
    }

    mbedtls_ssl_optimize_checksum( ssl, ssl->transform_negotiate->ciphersuite_info );

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "server hello, session id len.: %d", n ) );
    MBEDTLS_SSL_DEBUG_BUF( 3,   "server hello, session id", buf + 35, n );

    /*
     * Check if the session can be resumed
     */
    if( ssl->handshake->resume == 0 || n == 0 ||
#if defined(MBEDTLS_SSL_RENEGOTIATION)
        ssl->renego_status != MBEDTLS_SSL_INITIAL_HANDSHAKE ||
#endif
        ssl->session_negotiate->ciphersuite != i ||
        ssl->session_negotiate->compression != comp ||
        ssl->session_negotiate->id_len != n ||
        memcmp( ssl->session_negotiate->id, buf + 35, n ) != 0 )
    {
        ssl->state++;
        ssl->handshake->resume = 0;
#if defined(MBEDTLS_HAVE_TIME)
        ssl->session_negotiate->start = mbedtls_time( NULL );
#endif
        ssl->session_negotiate->ciphersuite = i;
        ssl->session_negotiate->compression = comp;
        ssl->session_negotiate->id_len = n;
        memcpy( ssl->session_negotiate->id, buf + 35, n );
    }